

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O0

TPZMatrix<double> * __thiscall
TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>::CreateAssemble
          (TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_> *this,
          TPZFMatrix<double> *rhs,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  int iVar1;
  int64_t iVar2;
  TPZMatrix<double> *this_00;
  undefined4 extraout_var;
  long *in_RSI;
  long *in_RDI;
  TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *mat;
  int64_t neq;
  TPZEquationFilter *in_stack_ffffffffffffff88;
  TPZMatrix<double> *this_01;
  TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>
  *in_stack_ffffffffffffffc0;
  
  TPZStrMatParInterface::InitCreateAssemble
            ((TPZStrMatParInterface *)((long)in_RDI + *(long *)(in_RDI[0x14] + -0x60) + 0xa0));
  iVar2 = TPZEquationFilter::NActiveEquations(in_stack_ffffffffffffff88);
  this_00 = (TPZMatrix<double> *)operator_new(800);
  TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>::TPZParFrontMatrix
            (in_stack_ffffffffffffffc0,(int64_t)this_00);
  if (*(int *)((long)in_RDI + 0xcc) != 0) {
    iVar1 = (*(this_00->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4f])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
              ((long *)CONCAT44(extraout_var,iVar1),*(undefined4 *)((long)in_RDI + 0xcc));
  }
  (**(code **)(*in_RSI + 0x70))(in_RSI,iVar2,1);
  this_01 = this_00;
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)this_00,
             (TPZAutoPointer<TPZGuiInterface> *)in_stack_ffffffffffffff88);
  (**(code **)(*in_RDI + 0x78))(in_RDI,this_01,in_RSI,&stack0xffffffffffffffc0);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer((TPZAutoPointer<TPZGuiInterface> *)this_01);
  return this_00;
}

Assistant:

TPZMatrix<TVar> * TPZParFrontStructMatrix<TFront,TVar,TPar>::CreateAssemble(TPZFMatrix<TVar> &rhs,TPZAutoPointer<TPZGuiInterface> guiInterface)
{
    TPar::InitCreateAssemble();
	
	//TPZFrontMatrix<TPZStackEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZStackEqnStorage, TFront>(fMesh->NEquations());
	
	//TPZFrontMatrix<TPZFileEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZFileEqnStorage, TFront>(fMesh->NEquations());
	int64_t neq = this->fEquationFilter.NActiveEquations();
	
	//
#ifdef STACKSTORAGE
	TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront> *mat = new TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront>(neq);
#else
    TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = new TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>(neq);
#endif
    if (this->fDecomposeType != ENoDecompose)
    {
        mat->GetFront().SetDecomposeType(this->fDecomposeType);
    }
	rhs.Redim(neq,1);
	
	Assemble(*mat,rhs,guiInterface);
	return mat;
	
}